

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformDerivative.cpp
# Opt level: O0

Matrix6x6 * __thiscall
iDynTree::TransformDerivative::asAdjointTransformWrenchDerivative
          (TransformDerivative *this,Transform *transform)

{
  double *dataPtr;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *other;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *other_00;
  VectorFixSize<3U> *this_00;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *this_01;
  MatrixFixSize<3U,_3U> *this_02;
  Transform *in_RDX;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_> *in_RSI;
  Stride<0,_0> *in_RDI;
  Matrix6x6 *ret;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> R;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> p;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> dR;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> dp;
  Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> retEigen;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd58;
  Stride<0,_0> *this_03;
  Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffd70;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffea8;
  
  this_03 = in_RDI;
  MatrixFixSize<6U,_6U>::MatrixFixSize((MatrixFixSize<6U,_6U> *)in_RDI);
  dataPtr = MatrixFixSize<6U,_6U>::data((MatrixFixSize<6U,_6U> *)this_03);
  Eigen::Stride<0,_0>::Stride(this_03);
  Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffffd70,dataPtr,this_03);
  other = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
           *)VectorFixSize<3U>::data((VectorFixSize<3U> *)in_RSI);
  Eigen::Stride<0,_0>::Stride(this_03);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)other,
             dataPtr,this_03);
  other_00 = (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>
              *)MatrixFixSize<3U,_3U>::data((MatrixFixSize<3U,_3U> *)(in_RSI + 0x18));
  Eigen::Stride<0,_0>::Stride(this_03);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)other,
             dataPtr,this_03);
  this_00 = &Transform::getPosition(in_RDX)->super_Vector3;
  this_01 = (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>
             *)VectorFixSize<3U>::data(this_00);
  Eigen::Stride<0,_0>::Stride(this_03);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)other,
             dataPtr,this_03);
  this_02 = &Transform::getRotation(in_RDX)->super_Matrix3x3;
  MatrixFixSize<3U,_3U>::data(this_02);
  Eigen::Stride<0,_0>::Stride(this_03);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)other,
             dataPtr,this_03);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            (in_RSI,(Index)other,(Index)dataPtr);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)this_03,in_stack_fffffffffffffd58);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            (in_RSI,(Index)other,(Index)dataPtr);
  Eigen::
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>_>
  ::setZero((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>_>
             *)this_03);
  mySkeww<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (in_stack_fffffffffffffea8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RSI,other);
  mySkeww<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (in_stack_fffffffffffffea8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RSI,other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,0>>
  ::operator+(this_01,other_00);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            (in_RSI,(Index)other,(Index)dataPtr);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)this_03,
            (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>_>
             *)in_stack_fffffffffffffd58);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            (in_RSI,(Index)other,(Index)dataPtr);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)this_03,in_stack_fffffffffffffd58);
  return (Matrix6x6 *)in_RDI;
}

Assistant:

Matrix6x6 TransformDerivative::asAdjointTransformWrenchDerivative(const Transform& transform) const
{
    Matrix6x6 ret;

    Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(ret.data());

    Eigen::Map<const Eigen::Vector3d> dp(this->posDerivative.data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > dR(this->rotDerivative.data());

    Eigen::Map<const Eigen::Vector3d> p(transform.getPosition().data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(transform.getRotation().data());

    retEigen.block<3,3>(0,0) = dR;
    retEigen.block<3,3>(0,3).setZero();
    retEigen.block<3,3>(3,0) = mySkeww(dp)*R + mySkeww(p)*dR;
    retEigen.block<3,3>(3,3) = dR;

    return ret;
}